

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

CanonicalDataSource __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::
currentCanonicalDataSource(ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  CanonicalDataSource CVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  CVar1 = HostData;
  if (this->hostBufferIsPopulated == false) {
    if ((this->renderTextureBuffer).
        super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        (this->renderAttributeBuffer).
        super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (this->dataGetsComputed == false) {
        std::operator+(&local_30,"ManagedBuffer ",&this->name);
        std::operator+(&local_50,&local_30,
                       " does not have a data in either host or device buffers, nor a compute function."
                      );
        exception(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_30);
        CVar1 = HostData;
      }
      else {
        CVar1 = NeedsCompute;
      }
    }
    else {
      CVar1 = RenderBuffer;
    }
  }
  return CVar1;
}

Assistant:

typename ManagedBuffer<T>::CanonicalDataSource ManagedBuffer<T>::currentCanonicalDataSource() {

  // Always prefer the host data if it is up to date
  if (hostBufferIsPopulated) {
    return CanonicalDataSource::HostData;
  }

  // Check if the render buffer contains the canonical data
  if (renderAttributeBuffer || renderTextureBuffer) {
    return CanonicalDataSource::RenderBuffer;
  }

  if (dataGetsComputed) {
    return CanonicalDataSource::NeedsCompute;
  }

  // error! should always be one of the above
  exception("ManagedBuffer " + name +
            " does not have a data in either host or device buffers, nor a compute function.");
  return CanonicalDataSource::HostData; // dummy return
}